

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
node::anon_unknown_2::ChainImpl::deleteRwSettings(ChainImpl *this,string *name,bool write)

{
  ArgsManager *pAVar1;
  bool bVar2;
  ArgsManager **ppAVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *this_00;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  pVar4;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ppAVar3 = inline_assertion_check<true,ArgsManager*&>
                      (&this->m_node->args,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x35c,"args","m_node.args");
  pAVar1 = *ppAVar3;
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)pAVar1;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  this_00 = &(pAVar1->m_settings).rw_settings;
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
          ::equal_range(&this_00->_M_t,name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  bVar2 = true;
  if (write) {
    ppAVar3 = inline_assertion_check<true,ArgsManager*&>
                        (&this->m_node->args,
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                         ,0x35c,"args","m_node.args");
    bVar2 = ArgsManager::WriteSettingsFile
                      (*ppAVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)0x0,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool deleteRwSettings(const std::string& name, bool write) override
    {
        args().LockSettings([&](common::Settings& settings) {
            settings.rw_settings.erase(name);
        });
        return !write || args().WriteSettingsFile();
    }